

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkFile
          (DescriptorBuilder *this,FileDescriptor *file,FileDescriptorProto *proto)

{
  long lVar1;
  FileOptions *pFVar2;
  Type *proto_00;
  Type *proto_01;
  Type *proto_02;
  Type *proto_03;
  long lVar3;
  DescriptorBuilder *this_00;
  long lVar4;
  
  if (*(long *)(file + 0xa0) == 0) {
    pFVar2 = FileOptions::default_instance();
    *(FileOptions **)(file + 0xa0) = pFVar2;
  }
  if (0 < *(int *)(file + 0x58)) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      lVar1 = *(long *)(file + 0x60);
      proto_00 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                           (&(proto->message_type_).super_RepeatedPtrFieldBase,(int)lVar4);
      CrossLinkMessage(this,(Descriptor *)(lVar1 + lVar3),proto_00);
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0xa8;
    } while (lVar4 < *(int *)(file + 0x58));
  }
  if (0 < *(int *)(file + 0x88)) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      lVar1 = *(long *)(file + 0x98);
      proto_01 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                           (&(proto->extension_).super_RepeatedPtrFieldBase,(int)lVar4);
      CrossLinkField(this,(FieldDescriptor *)(lVar1 + lVar3),proto_01);
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0xa8;
    } while (lVar4 < *(int *)(file + 0x88));
  }
  if (0 < *(int *)(file + 0x68)) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      lVar1 = *(long *)(file + 0x70);
      this_00 = (DescriptorBuilder *)&proto->enum_type_;
      proto_02 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                           (&(proto->enum_type_).super_RepeatedPtrFieldBase,(int)lVar4);
      CrossLinkEnum(this_00,(EnumDescriptor *)(lVar1 + lVar3),proto_02);
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x38;
    } while (lVar4 < *(int *)(file + 0x68));
  }
  if (0 < *(int *)(file + 0x78)) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      lVar1 = *(long *)(file + 0x80);
      proto_03 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
                           (&(proto->service_).super_RepeatedPtrFieldBase,(int)lVar4);
      CrossLinkService(this,(ServiceDescriptor *)(lVar1 + lVar3),proto_03);
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x30;
    } while (lVar4 < *(int *)(file + 0x78));
  }
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkFile(
    FileDescriptor* file, const FileDescriptorProto& proto) {
  if (file->options_ == NULL) {
    file->options_ = &FileOptions::default_instance();
  }

  for (int i = 0; i < file->message_type_count(); i++) {
    CrossLinkMessage(&file->message_types_[i], proto.message_type(i));
  }

  for (int i = 0; i < file->extension_count(); i++) {
    CrossLinkField(&file->extensions_[i], proto.extension(i));
  }

  for (int i = 0; i < file->enum_type_count(); i++) {
    CrossLinkEnum(&file->enum_types_[i], proto.enum_type(i));
  }

  for (int i = 0; i < file->service_count(); i++) {
    CrossLinkService(&file->services_[i], proto.service(i));
  }
}